

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_abs16_mips64el(void *d,void *a,uint32_t desc)

{
  intptr_t oprsz_00;
  short local_38;
  long lStack_30;
  int16_t aa;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (lStack_30 = 0; lStack_30 < oprsz_00; lStack_30 = lStack_30 + 2) {
    local_38 = *(short *)((long)a + lStack_30);
    if (local_38 < 0) {
      local_38 = -local_38;
    }
    *(short *)((long)d + lStack_30) = local_38;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_abs16)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int16_t)) {
        int16_t aa = *(int16_t *)((char *)a + i);
        *(int16_t *)((char *)d + i) = aa < 0 ? -aa : aa;
    }
    clear_high(d, oprsz, desc);
}